

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O0

BignumDtoaMode double_conversion::DtoaToBignumDtoaMode(DtoaMode dtoa_mode)

{
  undefined4 in_EDI;
  BignumDtoaMode local_4;
  
  switch(in_EDI) {
  case 0:
    local_4 = BIGNUM_DTOA_SHORTEST;
    break;
  case 1:
    local_4 = BIGNUM_DTOA_SHORTEST_SINGLE;
    break;
  case 2:
    local_4 = BIGNUM_DTOA_FIXED;
    break;
  case 3:
    local_4 = BIGNUM_DTOA_PRECISION;
    break;
  default:
    abort();
  }
  return local_4;
}

Assistant:

static BignumDtoaMode DtoaToBignumDtoaMode(
    DoubleToStringConverter::DtoaMode dtoa_mode) {
  switch (dtoa_mode) {
    case DoubleToStringConverter::SHORTEST:  return BIGNUM_DTOA_SHORTEST;
    case DoubleToStringConverter::SHORTEST_SINGLE:
        return BIGNUM_DTOA_SHORTEST_SINGLE;
    case DoubleToStringConverter::FIXED:     return BIGNUM_DTOA_FIXED;
    case DoubleToStringConverter::PRECISION: return BIGNUM_DTOA_PRECISION;
    default:
      DOUBLE_CONVERSION_UNREACHABLE();
  }
}